

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

bool __thiscall
BuildLog::RecordCommand(BuildLog *this,Edge *edge,int start_time,int end_time,TimeStamp mtime)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  pointer ppVar4;
  LogEntry *this_00;
  size_t extraout_RDX;
  StringPiece command_00;
  pair<const_StringPiece,_BuildLog::LogEntry_*> local_d0;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_b8;
  LogEntry *local_b0;
  LogEntry *log_entry;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_98;
  iterator i;
  string *path;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_80;
  iterator out;
  StringPiece local_68;
  uint64_t local_58;
  uint64_t command_hash;
  string command;
  TimeStamp mtime_local;
  int end_time_local;
  int start_time_local;
  Edge *edge_local;
  BuildLog *this_local;
  
  command.field_2._8_8_ = mtime;
  Edge::EvaluateCommand_abi_cxx11_((string *)&command_hash,edge,true);
  StringPiece::StringPiece(&local_68,(string *)&command_hash);
  command_00.len_ = extraout_RDX;
  command_00.str_ = (char *)local_68.len_;
  local_58 = LogEntry::HashCommand((LogEntry *)local_68.str_,command_00);
  local_80._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&edge->outputs_);
  do {
    path = (string *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&edge->outputs_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       &path);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_001074f1:
      std::__cxx11::string::~string((string *)&command_hash);
      return this_local._7_1_;
    }
    ppNVar3 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_80);
    i.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>)
         Node::path_abi_cxx11_(*ppNVar3);
    StringPiece::StringPiece
              ((StringPiece *)&log_entry,
               (string *)
               i.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
               ._M_cur);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
         ::find(&this->entries_,(key_type *)&log_entry);
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
         ::end(&this->entries_);
    bVar1 = std::__detail::operator!=(&local_98,&local_b8);
    if (bVar1) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                           *)&local_98);
      local_b0 = ppVar4->second;
    }
    else {
      this_00 = (LogEntry *)operator_new(0x38);
      LogEntry::LogEntry(this_00,(string *)
                                 i.
                                 super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                                 ._M_cur);
      local_b0 = this_00;
      std::pair<const_StringPiece,_BuildLog::LogEntry_*>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BuildLog::LogEntry_*&,_true>
                (&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_b0);
      std::
      unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
      ::insert(&this->entries_,&local_d0);
    }
    local_b0->command_hash = local_58;
    local_b0->start_time = start_time;
    local_b0->end_time = end_time;
    local_b0->mtime = command.field_2._8_8_;
    bVar1 = OpenForWriteIfNeeded(this);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_001074f1;
    }
    if (this->log_file_ != (FILE *)0x0) {
      bVar1 = WriteEntry(this,this->log_file_,local_b0);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_001074f1;
      }
      iVar2 = fflush((FILE *)this->log_file_);
      if (iVar2 != 0) {
        this_local._7_1_ = false;
        goto LAB_001074f1;
      }
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_80);
  } while( true );
}

Assistant:

bool BuildLog::RecordCommand(Edge* edge, int start_time, int end_time,
                             TimeStamp mtime) {
  string command = edge->EvaluateCommand(true);
  uint64_t command_hash = LogEntry::HashCommand(command);
  for (vector<Node*>::iterator out = edge->outputs_.begin();
       out != edge->outputs_.end(); ++out) {
    const string& path = (*out)->path();
    Entries::iterator i = entries_.find(path);
    LogEntry* log_entry;
    if (i != entries_.end()) {
      log_entry = i->second;
    } else {
      log_entry = new LogEntry(path);
      entries_.insert(Entries::value_type(log_entry->output, log_entry));
    }
    log_entry->command_hash = command_hash;
    log_entry->start_time = start_time;
    log_entry->end_time = end_time;
    log_entry->mtime = mtime;

    if (!OpenForWriteIfNeeded()) {
      return false;
    }
    if (log_file_) {
      if (!WriteEntry(log_file_, *log_entry))
        return false;
      if (fflush(log_file_) != 0) {
          return false;
      }
    }
  }
  return true;
}